

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

void lua_rawget(lua_State *L,int idx)

{
  StkId pTVar1;
  TValue *pTVar2;
  
  pTVar2 = index2addr(L,idx);
  pTVar2 = luaH_get(&((pTVar2->value_).gc)->h,L->top + -1);
  pTVar1 = L->top;
  pTVar1[-1].value_ = pTVar2->value_;
  pTVar1[-1].tt_ = pTVar2->tt_;
  return;
}

Assistant:

LUA_API void lua_rawget (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  t = index2addr(L, idx);
  api_check(L, ttistable(t), "table expected");
  setobj2s(L, L->top - 1, luaH_get(hvalue(t), L->top - 1));
  lua_unlock(L);
}